

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O2

int32_t __thiscall
charls::context_run_mode::compute_error_value(context_run_mode *this,int32_t temp,int32_t k)

{
  bool bVar1;
  uint uVar2;
  int error_value;
  char *__assertion;
  
  error_value = (int)((temp & 1U) + temp) / 2;
  if (k == 0) {
    uVar2 = (uint)((uint)this->n_ <= (uint)this->nn_ * 2);
  }
  else {
    uVar2 = 1;
  }
  if (uVar2 == (temp & 1U)) {
    bVar1 = compute_map(this,-error_value,k);
    if (bVar1 == (bool)((byte)temp & 1)) {
      return -error_value;
    }
    __assertion = "map == compute_map(-error_value_abs, k)";
    uVar2 = 0x4b;
  }
  else {
    bVar1 = compute_map(this,error_value,k);
    if (bVar1 == (bool)((byte)temp & 1)) {
      return error_value;
    }
    __assertion = "map == compute_map(error_value_abs, k)";
    uVar2 = 0x4f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                ,uVar2,
                "int32_t charls::context_run_mode::compute_error_value(const int32_t, const int32_t) const"
               );
}

Assistant:

FORCE_INLINE int32_t compute_error_value(const int32_t temp, const int32_t k) const noexcept
    {
        const bool map = temp & 1;
        const int32_t error_value_abs{(temp + static_cast<int32_t>(map)) / 2};

        if ((k != 0 || (2 * nn_ >= n_)) == map)
        {
            ASSERT(map == compute_map(-error_value_abs, k));
            return -error_value_abs;
        }

        ASSERT(map == compute_map(error_value_abs, k));
        return error_value_abs;
    }